

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSat.c
# Opt level: O0

int Cudd_ShortestLength(DdManager *manager,DdNode *f,int *weight)

{
  ulong uVar1;
  int iVar2;
  int local_48;
  int cost;
  int complement;
  cuddPathPair *my_pair;
  st__table *visited;
  DdNode *F;
  int *weight_local;
  DdNode *f_local;
  DdManager *manager_local;
  
  one = manager->one;
  zero = manager->zero;
  if ((f == (DdNode *)((ulong)one ^ 1)) || (f == zero)) {
    manager_local._4_4_ = 1000000;
  }
  else {
    F = (DdNode *)weight;
    weight_local = (int *)f;
    f_local = &manager->sentinel;
    my_pair = (cuddPathPair *)st__init_table(st__ptrcmp,st__ptrhash);
    getShortest((DdNode *)weight_local,(int *)F,(int *)0x0,(st__table *)my_pair);
    uVar1 = (ulong)weight_local & 1;
    visited = (st__table *)((ulong)weight_local & 0xfffffffffffffffe);
    iVar2 = st__lookup((st__table *)my_pair,(char *)visited,(char **)&cost);
    if (iVar2 == 0) {
      manager_local._4_4_ = -1;
    }
    else {
      if (uVar1 == 0) {
        local_48 = *_cost;
      }
      else {
        local_48 = _cost[1];
      }
      st__foreach((st__table *)my_pair,freePathPair,(char *)0x0);
      st__free_table((st__table *)my_pair);
      manager_local._4_4_ = local_48;
    }
  }
  return manager_local._4_4_;
}

Assistant:

int
Cudd_ShortestLength(
  DdManager * manager,
  DdNode * f,
  int * weight)
{
    register    DdNode  *F;
    st__table    *visited;
    cuddPathPair *my_pair;
    int         complement, cost;

    one = DD_ONE(manager);
    zero = DD_ZERO(manager);

    if (f == Cudd_Not(one) || f == zero) {
        return(DD_BIGGY);
    }

    /* From this point on, a path exists. */
    /* Initialize visited table and support. */
    visited = st__init_table( st__ptrcmp, st__ptrhash);

    /* Now get the length of the shortest path(s) from f to 1. */
    (void) getShortest(f, weight, NULL, visited);

    complement = Cudd_IsComplement(f);

    F = Cudd_Regular(f);

    if (! st__lookup(visited, (const char *)F, (char **)&my_pair)) return(CUDD_OUT_OF_MEM);
    
    if (complement) {
        cost = my_pair->neg;
    } else {
        cost = my_pair->pos;
    }

    st__foreach(visited, freePathPair, NULL);
    st__free_table(visited);

    return(cost);

}